

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.cpp
# Opt level: O0

void __thiscall fsbridge::FileLock::FileLock(FileLock *this,path *file)

{
  int iVar1;
  value_type *__file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  path *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  
  this_00 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
             (in_FS_OFFSET + 0x28);
  pbVar2 = in_RDI;
  std::__cxx11::string::string(in_RDI);
  *(undefined4 *)&pbVar2[1]._M_dataplus._M_p = 0xffffffff;
  __file = std::filesystem::__cxx11::path::c_str(in_stack_ffffffffffffff98);
  iVar1 = open(__file,2);
  *(int *)&in_RDI[1]._M_dataplus._M_p = iVar1;
  if (*(int *)&in_RDI[1]._M_dataplus._M_p == -1) {
    GetErrorReason_abi_cxx11_();
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (this_00,in_stack_fffffffffffffff0);
    std::__cxx11::string::~string(&in_stack_ffffffffffffff98->_M_pathname);
  }
  if (*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(in_FS_OFFSET + 0x28)
      == this_00) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

FileLock::FileLock(const fs::path& file)
{
    fd = open(file.c_str(), O_RDWR);
    if (fd == -1) {
        reason = GetErrorReason();
    }
}